

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_group_scrolled_offset_begin
                  (nk_context *ctx,nk_uint *x_offset,nk_uint *y_offset,char *title,nk_flags flags)

{
  long lVar1;
  long lVar2;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  uint in_R8D;
  nk_flags f;
  nk_rect *c;
  nk_window *win;
  nk_window panel;
  nk_rect bounds;
  nk_context *in_stack_fffffffffffffdb8;
  void *in_stack_fffffffffffffdc0;
  nk_context *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  uint uVar3;
  undefined1 local_218 [72];
  uint local_1d0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  undefined1 auStack_1b0 [64];
  void *local_170;
  nk_panel_type in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  nk_context *in_stack_ffffffffffffff08;
  float local_3c;
  float fStack_38;
  float local_34;
  float in_stack_ffffffffffffffd0;
  uint uVar4;
  
  lVar1 = *(long *)(in_RDI + 0x40d8);
  nk_panel_alloc_space
            ((nk_rect *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             in_stack_fffffffffffffdc8);
  lVar2 = *(long *)(lVar1 + 0xa8);
  if (((((*(float *)(lVar2 + 0x44) + *(float *)(lVar2 + 0x4c) <= local_3c) ||
        (local_3c + local_34 <= *(float *)(lVar2 + 0x44))) ||
       (*(float *)(lVar2 + 0x48) + *(float *)(lVar2 + 0x50) <= fStack_38)) ||
      (fStack_38 + in_stack_ffffffffffffffd0 <= *(float *)(lVar2 + 0x48))) && ((in_R8D & 2) == 0)) {
    return 0;
  }
  local_1d0 = in_R8D;
  if ((*(uint *)(lVar1 + 0x48) & 0x1000) != 0) {
    local_1d0 = in_R8D | 0x1000;
  }
  nk_zero(in_stack_fffffffffffffdc0,(nk_size)in_stack_fffffffffffffdb8);
  local_1bc = *in_RSI;
  local_1b8 = *in_RDX;
  uVar4 = local_1d0;
  memcpy(auStack_1b0,(void *)(lVar1 + 0x68),0x40);
  local_170 = nk_create_panel(in_stack_fffffffffffffdb8);
  *(undefined1 **)(in_RDI + 0x40d8) = local_218;
  nk_panel_begin(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  memcpy((void *)(lVar1 + 0x68),auStack_1b0,0x40);
  *(undefined8 *)(lVar1 + 0x70) = *(undefined8 *)((long)local_170 + 0x44);
  *(undefined8 *)(lVar1 + 0x78) = *(undefined8 *)((long)local_170 + 0x4c);
  *(undefined4 **)((long)local_170 + 0x18) = in_RSI;
  *(undefined4 **)((long)local_170 + 0x20) = in_RDX;
  *(undefined8 *)((long)local_170 + 0x1b8) = *(undefined8 *)(lVar1 + 0xa8);
  *(void **)(lVar1 + 0xa8) = local_170;
  *(long *)(in_RDI + 0x40d8) = lVar1;
  if (((*(uint *)((long)local_170 + 4) & 0x4000) != 0) ||
     ((*(uint *)((long)local_170 + 4) & 0x8000) != 0)) {
    uVar3 = *(uint *)((long)local_170 + 4);
    nk_group_scrolled_end((nk_context *)CONCAT44(uVar4,in_stack_ffffffffffffffd0));
    if ((uVar3 & 0x4000) != 0) {
      return 0x4000;
    }
    if ((uVar3 & 0x8000) != 0) {
      return 0x8000;
    }
  }
  return 1;
}

Assistant:

NK_API nk_bool
nk_group_scrolled_offset_begin(struct nk_context *ctx,
nk_uint *x_offset, nk_uint *y_offset, const char *title, nk_flags flags)
{
struct nk_rect bounds;
struct nk_window panel;
struct nk_window *win;

win = ctx->current;
nk_panel_alloc_space(&bounds, ctx);
{const struct nk_rect *c = &win->layout->clip;
if (!NK_INTERSECT(c->x, c->y, c->w, c->h, bounds.x, bounds.y, bounds.w, bounds.h) &&
!(flags & NK_WINDOW_MOVABLE)) {
return 0;
}}
if (win->flags & NK_WINDOW_ROM)
flags |= NK_WINDOW_ROM;

/* initialize a fake window to create the panel from */
nk_zero(&panel, sizeof(panel));
panel.bounds = bounds;
panel.flags = flags;
panel.scrollbar.x = *x_offset;
panel.scrollbar.y = *y_offset;
panel.buffer = win->buffer;
panel.layout = (struct nk_panel*)nk_create_panel(ctx);
ctx->current = &panel;
nk_panel_begin(ctx, (flags & NK_WINDOW_TITLE) ? title: 0, NK_PANEL_GROUP);

win->buffer = panel.buffer;
win->buffer.clip = panel.layout->clip;
panel.layout->offset_x = x_offset;
panel.layout->offset_y = y_offset;
panel.layout->parent = win->layout;
win->layout = panel.layout;

ctx->current = win;
if ((panel.layout->flags & NK_WINDOW_CLOSED) ||
(panel.layout->flags & NK_WINDOW_MINIMIZED))
{
nk_flags f = panel.layout->flags;
nk_group_scrolled_end(ctx);
if (f & NK_WINDOW_CLOSED)
return NK_WINDOW_CLOSED;
if (f & NK_WINDOW_MINIMIZED)
return NK_WINDOW_MINIMIZED;
}
return 1;
}